

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O0

xmlSchemaParserCtxtPtr xmlSchemaNewParserCtxt(char *URL)

{
  xmlDictPtr pxVar1;
  xmlChar *pxVar2;
  xmlSchemaParserCtxtPtr ret;
  char *URL_local;
  
  if (URL == (char *)0x0) {
    URL_local = (char *)0x0;
  }
  else {
    URL_local = (char *)xmlSchemaParserCtxtCreate();
    if ((xmlSchemaParserCtxtPtr)URL_local == (xmlSchemaParserCtxtPtr)0x0) {
      URL_local = (char *)0x0;
    }
    else {
      pxVar1 = xmlDictCreate();
      ((xmlSchemaParserCtxtPtr)URL_local)->dict = pxVar1;
      pxVar2 = xmlDictLookup(((xmlSchemaParserCtxtPtr)URL_local)->dict,(xmlChar *)URL,-1);
      ((xmlSchemaParserCtxtPtr)URL_local)->URL = pxVar2;
    }
  }
  return (xmlSchemaParserCtxtPtr)URL_local;
}

Assistant:

xmlSchemaParserCtxtPtr
xmlSchemaNewParserCtxt(const char *URL)
{
    xmlSchemaParserCtxtPtr ret;

    if (URL == NULL)
        return (NULL);

    ret = xmlSchemaParserCtxtCreate();
    if (ret == NULL)
	return(NULL);
    ret->dict = xmlDictCreate();
    ret->URL = xmlDictLookup(ret->dict, (const xmlChar *) URL, -1);
    return (ret);
}